

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O0

void __thiscall
Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>::~gemm_blocking_space
          (gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> *this)

{
  gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> *this_local;
  
  aligned_delete<double>((this->super_level3_blocking<double,_double>).m_blockA,this->m_sizeA);
  aligned_delete<double>((this->super_level3_blocking<double,_double>).m_blockB,this->m_sizeB);
  aligned_delete<double>((this->super_level3_blocking<double,_double>).m_blockW,this->m_sizeW);
  return;
}

Assistant:

~gemm_blocking_space()
    {
      aligned_delete(this->m_blockA, m_sizeA);
      aligned_delete(this->m_blockB, m_sizeB);
      aligned_delete(this->m_blockW, m_sizeW);
    }